

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fDrawTests.cpp
# Opt level: O0

void deqp::gles3::Functional::anon_unknown_0::addTestIterations
               (DrawTest *test,DrawTestSpec *baseSpec,TestIterationType type)

{
  undefined1 local_70 [8];
  DrawTestSpec spec;
  TestIterationType type_local;
  DrawTestSpec *baseSpec_local;
  DrawTest *test_local;
  
  spec.attribs.
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = type;
  deqp::gls::DrawTestSpec::DrawTestSpec((DrawTestSpec *)local_70,baseSpec);
  if (spec.attribs.
      super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == TYPE_DRAW_COUNT) {
    spec.apiType.m_bits = 1;
    deqp::gls::DrawTest::addIteration(test,(DrawTestSpec *)local_70,"draw count = 1");
    spec.apiType.m_bits = 5;
    deqp::gls::DrawTest::addIteration(test,(DrawTestSpec *)local_70,"draw count = 5");
    spec.apiType.m_bits = 0x19;
    deqp::gls::DrawTest::addIteration(test,(DrawTestSpec *)local_70,"draw count = 25");
  }
  else if (spec.attribs.
           super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == TYPE_INSTANCE_COUNT) {
    spec.indexMin = 1;
    deqp::gls::DrawTest::addIteration(test,(DrawTestSpec *)local_70,"instance count = 1");
    spec.indexMin = 4;
    deqp::gls::DrawTest::addIteration(test,(DrawTestSpec *)local_70,"instance count = 4");
    spec.indexMin = 0xb;
    deqp::gls::DrawTest::addIteration(test,(DrawTestSpec *)local_70,"instance count = 11");
  }
  else if (spec.attribs.
           super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == TYPE_INDEX_RANGE) {
    spec.indexStorage = STORAGE_USER;
    spec.first = 0x17;
    deqp::gls::DrawTest::addIteration(test,(DrawTestSpec *)local_70,"index range = [0, 23]");
    spec.indexStorage = 0x17;
    spec.first = 0x28;
    deqp::gls::DrawTest::addIteration(test,(DrawTestSpec *)local_70,"index range = [23, 40]");
    if (local_70._4_4_ == PRIMITIVE_POINTS) {
      spec.indexStorage = 5;
      spec.first = 5;
      deqp::gls::DrawTest::addIteration(test,(DrawTestSpec *)local_70,"index range = [5, 5]");
    }
  }
  deqp::gls::DrawTestSpec::~DrawTestSpec((DrawTestSpec *)local_70);
  return;
}

Assistant:

static void addTestIterations (gls::DrawTest* test, const gls::DrawTestSpec& baseSpec, TestIterationType type)
{
	gls::DrawTestSpec spec(baseSpec);

	if (type == TYPE_DRAW_COUNT)
	{
		spec.primitiveCount = 1;
		test->addIteration(spec, "draw count = 1");

		spec.primitiveCount = 5;
		test->addIteration(spec, "draw count = 5");

		spec.primitiveCount = 25;
		test->addIteration(spec, "draw count = 25");
	}
	else if (type == TYPE_INSTANCE_COUNT)
	{
		spec.instanceCount = 1;
		test->addIteration(spec, "instance count = 1");

		spec.instanceCount = 4;
		test->addIteration(spec, "instance count = 4");

		spec.instanceCount = 11;
		test->addIteration(spec, "instance count = 11");
	}
	else if (type == TYPE_INDEX_RANGE)
	{
		spec.indexMin = 0;
		spec.indexMax = 23;
		test->addIteration(spec, "index range = [0, 23]");

		spec.indexMin = 23;
		spec.indexMax = 40;
		test->addIteration(spec, "index range = [23, 40]");

		// Only makes sense with points
		if (spec.primitive == gls::DrawTestSpec::PRIMITIVE_POINTS)
		{
			spec.indexMin = 5;
			spec.indexMax = 5;
			test->addIteration(spec, "index range = [5, 5]");
		}
	}
	else
		DE_ASSERT(false);
}